

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

void cf_close(Curl_cfilter *cf,Curl_easy *data)

{
  ssl_peer *peer;
  
  peer = (ssl_peer *)cf->ctx;
  if (peer != (ssl_peer *)0x0) {
    (*Curl_ssl->close)(cf,data);
    *(undefined4 *)&peer[2].hostname = 0;
    Curl_ssl_peer_cleanup(peer);
  }
  cf->field_0x24 = cf->field_0x24 & 0xfe;
  return;
}

Assistant:

static void cf_close(struct Curl_cfilter *cf, struct Curl_easy *data)
{
  struct ssl_connect_data *connssl = cf->ctx;
  if(connssl) {
    Curl_ssl->close(cf, data);
    connssl->state = ssl_connection_none;
    Curl_ssl_peer_cleanup(&connssl->peer);
  }
  cf->connected = FALSE;
}